

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O1

void __thiscall HDualRow::choose_final(HDualRow *this)

{
  int *__args;
  double dVar1;
  pointer ppVar2;
  int *piVar3;
  double *pdVar4;
  HModel *pHVar5;
  pointer piVar6;
  iterator iVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  pointer ppVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  double *pdVar25;
  ulong uVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int local_5c;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar10 = rdtsc();
  uVar15 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar11._4_4_ = uVar15;
  auVar11._0_4_ = uVar15;
  auVar11._8_4_ = 0;
  auVar28._0_12_ = auVar11 << 0x20;
  auVar28._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xd] =
       (auVar28._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  iVar22 = this->workCount;
  this->workCount = 0;
  local_48 = ABS(this->workDelta);
  __args = &this->workCount;
  dVar27 = this->workTheta * 10.0 + 1e-07;
  ppVar2 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar3 = this->workMove;
  pdVar25 = this->workDual;
  dVar32 = 0.0;
  do {
    iVar21 = *__args;
    if (iVar21 < iVar22) {
      pdVar4 = this->workRange;
      lVar23 = (long)iVar22 - (long)iVar21;
      ppVar14 = ppVar2 + iVar21;
      do {
        iVar21 = ppVar14->first;
        dVar34 = ppVar14->second;
        if ((double)piVar3[iVar21] * pdVar25[iVar21] <= dVar27 * dVar34) {
          iVar24 = *__args;
          *__args = iVar24 + 1;
          iVar18 = ppVar2[iVar24].first;
          ppVar2[iVar24].first = ppVar14->first;
          ppVar14->first = iVar18;
          dVar35 = ppVar2[iVar24].second;
          ppVar2[iVar24].second = dVar34;
          ppVar14->second = dVar35;
          dVar32 = dVar32 + dVar34 * pdVar4[iVar21];
        }
        ppVar14 = ppVar14 + 1;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
  } while ((dVar32 < local_48) && (dVar27 = dVar27 * 10.0, *__args != iVar22));
  pHVar5 = this->workModel;
  uVar10 = rdtsc();
  uVar15 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar12._4_4_ = uVar15;
  auVar12._0_4_ = uVar15;
  auVar12._8_4_ = 0;
  auVar29._0_12_ = auVar12 << 0x20;
  auVar29._12_4_ = 0x45300000;
  (pHVar5->timer).itemTicks[0xd] =
       (((auVar29._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) -
       (pHVar5->timer).itemStart[0xd]) + (pHVar5->timer).itemTicks[0xd];
  uVar10 = rdtsc();
  uVar16 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar30._8_4_ = uVar16;
  auVar30._0_8_ = CONCAT44(uVar15,uVar16) << 0x20;
  auVar30._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0xe] =
       (auVar30._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
  local_58 = this->workModel->dblOption[2];
  iVar22 = this->workCount;
  this->workCount = 0;
  piVar6 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar6) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar6;
  }
  dVar27 = this->workTheta;
  local_5c = 0;
  iVar7._M_current =
       (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uStack_40 = 0;
  if (iVar7._M_current ==
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->workGroup,iVar7,&local_5c)
    ;
  }
  else {
    *iVar7._M_current = 0;
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar7._M_current + 1;
  }
  dVar32 = 1e-12;
  dVar34 = local_58;
  dVar35 = local_48;
  while (dVar27 < 1e+18) {
    iVar21 = *__args;
    if (iVar21 < iVar22) {
      ppVar2 = (this->workData).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar3 = this->workMove;
      pdVar25 = this->workDual;
      pdVar4 = this->workRange;
      lVar23 = (long)iVar22 - (long)iVar21;
      ppVar14 = ppVar2 + iVar21;
      dVar36 = 1e+100;
      do {
        iVar21 = ppVar14->first;
        dVar1 = ppVar14->second;
        dVar33 = (double)piVar3[iVar21] * pdVar25[iVar21];
        if (dVar33 <= dVar27 * dVar1) {
          iVar24 = *__args;
          *__args = iVar24 + 1;
          iVar18 = ppVar2[iVar24].first;
          ppVar2[iVar24].first = ppVar14->first;
          ppVar14->first = iVar18;
          dVar33 = ppVar2[iVar24].second;
          ppVar2[iVar24].second = dVar1;
          ppVar14->second = dVar33;
          dVar32 = dVar32 + dVar1 * pdVar4[iVar21];
        }
        else {
          dVar33 = dVar33 + dVar34;
          if (dVar33 < dVar36 * dVar1) {
            dVar36 = dVar33 / dVar1;
          }
        }
        ppVar14 = ppVar14 + 1;
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
    }
    else {
      dVar36 = 1e+100;
    }
    iVar7._M_current =
         (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_50 = dVar36;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->workGroup,iVar7,__args);
      dVar34 = local_58;
      dVar35 = local_48;
      dVar27 = local_50;
    }
    else {
      *iVar7._M_current = this->workCount;
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      dVar27 = dVar36;
    }
    if ((dVar35 <= dVar32) || (*__args == iVar22)) break;
  }
  if ((long)*__args < 1) {
    dVar27 = 0.0;
  }
  else {
    lVar23 = 0;
    dVar32 = 0.0;
    do {
      dVar27 = *(double *)
                ((long)&((this->workData).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second + lVar23);
      if (dVar27 <= dVar32) {
        dVar27 = dVar32;
      }
      lVar23 = lVar23 + 0x10;
      dVar32 = dVar27;
    } while ((long)*__args * 0x10 != lVar23);
    dVar27 = dVar27 * 0.1;
  }
  piVar6 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar20 = (int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2) - 2;
  if ((int)uVar20 < 0) {
    lVar23 = -1;
    lVar17 = -1;
  }
  else {
    dVar32 = 1.0;
    if (dVar27 <= 1.0) {
      dVar32 = dVar27;
    }
    ppVar2 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar21 = -1;
    iVar22 = -1;
    uVar26 = (ulong)uVar20;
    do {
      iVar24 = piVar6[uVar26];
      iVar18 = -1;
      if (iVar24 < piVar6[uVar26 + 1]) {
        lVar23 = (long)piVar6[uVar26 + 1] - (long)iVar24;
        pdVar25 = &ppVar2[iVar24].second;
        dVar27 = 0.0;
        iVar19 = -1;
        do {
          dVar34 = *pdVar25;
          iVar18 = iVar24;
          if (dVar34 <= dVar27) {
            bVar8 = NAN(dVar34);
            bVar9 = dVar27 == dVar34;
            dVar34 = dVar27;
            iVar18 = iVar19;
            if (((bVar9) && (!NAN(dVar27) && !bVar8)) &&
               (iVar18 = iVar24,
               this->workRand[ppVar2[iVar19].first] <=
               this->workRand[((pair<int,_double> *)(pdVar25 + -1))->first])) {
              iVar18 = iVar19;
            }
          }
          pdVar25 = pdVar25 + 2;
          iVar24 = iVar24 + 1;
          lVar23 = lVar23 + -1;
          dVar27 = dVar34;
          iVar19 = iVar18;
        } while (lVar23 != 0);
      }
      if (dVar32 < ppVar2[iVar18].second) {
        iVar22 = (int)uVar26;
        iVar21 = iVar18;
        break;
      }
      bVar8 = 0 < (long)uVar26;
      uVar26 = uVar26 - 1;
    } while (bVar8);
    lVar17 = (long)iVar21;
    lVar23 = (long)iVar22;
  }
  ppVar2 = (this->workData).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar22 = ppVar2[lVar17].first;
  this->workPivot = iVar22;
  uVar26 = -(ulong)(this->workDelta < 0.0);
  piVar3 = this->workMove;
  dVar32 = (double)piVar3[iVar22];
  dVar27 = (double)(uVar26 & (ulong)-ppVar2[lVar17].second | ~uVar26 & (ulong)ppVar2[lVar17].second)
           * dVar32;
  this->workAlpha = dVar27;
  dVar27 = (double)(-(ulong)(0.0 < dVar32 * this->workDual[iVar22]) &
                   (ulong)(this->workDual[iVar22] / dVar27));
  this->workTheta = dVar27;
  this->workCount = 0;
  if (0 < piVar6[lVar23]) {
    pdVar25 = this->workRange;
    lVar17 = 0;
    ppVar14 = ppVar2;
    do {
      iVar22 = ppVar14->first;
      iVar21 = piVar3[iVar22];
      dVar32 = pdVar25[iVar22];
      iVar24 = *__args;
      *__args = iVar24 + 1;
      ppVar2[iVar24].first = iVar22;
      ppVar2[iVar24].second = (double)iVar21 * dVar32;
      lVar17 = lVar17 + 1;
      ppVar14 = ppVar14 + 1;
    } while (lVar17 < piVar6[lVar23]);
  }
  if ((dVar27 == 0.0) && (!NAN(dVar27))) {
    *__args = 0;
  }
  uVar26 = (ulong)*__args;
  if (uVar26 != 0) {
    lVar23 = 0x3f;
    if (uVar26 != 0) {
      for (; uVar26 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar2,ppVar2 + uVar26,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar2,ppVar2 + uVar26);
  }
  pHVar5 = this->workModel;
  uVar10 = rdtsc();
  uVar15 = (undefined4)((ulong)uVar10 >> 0x20);
  auVar13._4_4_ = uVar15;
  auVar13._0_4_ = uVar15;
  auVar13._8_4_ = 0;
  auVar31._0_12_ = auVar13 << 0x20;
  auVar31._12_4_ = 0x45300000;
  (pHVar5->timer).itemTicks[0xe] =
       (((auVar31._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) -
       (pHVar5->timer).itemStart[0xe]) + (pHVar5->timer).itemTicks[0xe];
  return;
}

Assistant:

void HDualRow::choose_final() {
    /**
     * This routine choose the dual entering variable by
     * BFRT and EXPAND. (In sequential)
     *
     * It will
     * (1) reduce the candidates as a small collection
     * (2) choose by BFRT by going over break points
     * (3) choose final by alpha
     * (4) determine final flip variables
     */

    // 1. Reduce by large step BFRT
    workModel->timer.recordStart(HTICK_CHUZC2);
    int fullCount = workCount;
    workCount = 0;
    double totalChange = 0;
    double totalDelta = fabs(workDelta);
    double selectTheta = 10 * workTheta + 1e-7;
    for (;;) {
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double alpha = workData[i].second;
            double tight = workMove[iCol] * workDual[iCol];
            if (alpha * selectTheta >= tight) {
                swap(workData[workCount++], workData[i]);
                totalChange += workRange[iCol] * alpha;
            }
        }
        selectTheta *= 10;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }
    workModel->timer.recordFinish(HTICK_CHUZC2);

    // 2. Choose by small step BFRT
    workModel->timer.recordStart(HTICK_CHUZC3);
    const double Td = workModel->dblOption[DBLOPT_DUAL_TOL];
    fullCount = workCount;
    workCount = 0;
    totalChange = 1e-12;
    selectTheta = workTheta;
    workGroup.clear();
    workGroup.push_back(0);
    while (selectTheta < 1e18) {
        double remainTheta = 1e100;
        for (int i = workCount; i < fullCount; i++) {
            int iCol = workData[i].first;
            double value = workData[i].second;
            double dual = workMove[iCol] * workDual[iCol];
            // Tight satisfy
            if (dual <= selectTheta * value) {
                swap(workData[workCount++], workData[i]);
                totalChange += value * (workRange[iCol]);
            } else if (dual + Td < remainTheta * value) {
                remainTheta = (dual + Td) / value;
            }
        }
        workGroup.push_back(workCount);
        selectTheta = remainTheta;
        if (totalChange >= totalDelta || workCount == fullCount)
            break;
    }

    // 3. Choose large alpha
    double finalCompare = 0;
    for (int i = 0; i < workCount; i++)
        finalCompare = max(finalCompare, workData[i].second);
    finalCompare = min(0.1 * finalCompare, 1.0);
    int countGroup = workGroup.size() - 1;
    int breakGroup = -1;
    int breakIndex = -1;
    for (int iGroup = countGroup - 1; iGroup >= 0; iGroup--) {
        double dMaxFinal = 0;
        int iMaxFinal = -1;
        for (int i = workGroup[iGroup]; i < workGroup[iGroup + 1]; i++) {
            if (dMaxFinal < workData[i].second) {
                dMaxFinal = workData[i].second;
                iMaxFinal = i;
            } else if (dMaxFinal == workData[i].second) {
                int jCol = workData[iMaxFinal].first;
                int iCol = workData[i].first;
                if (workRand[iCol] < workRand[jCol]) {
                    iMaxFinal = i;
                }
            }
        }

        if (workData[iMaxFinal].second > finalCompare) {
            breakIndex = iMaxFinal;
            breakGroup = iGroup;
            break;
        }

    }

    int sourceOut = workDelta < 0 ? -1 : 1;
    workPivot = workData[breakIndex].first;
    workAlpha = workData[breakIndex].second * sourceOut * workMove[workPivot];
    if (workDual[workPivot] * workMove[workPivot] > 0)
        workTheta = workDual[workPivot] / workAlpha;
    else
        workTheta = 0;

    // 4. Determine BFRT flip index: flip all
    fullCount = breakIndex;
    workCount = 0;
    for (int i = 0; i < workGroup[breakGroup]; i++) {
        const int iCol = workData[i].first;
        const int move = workMove[iCol];
        workData[workCount++] = make_pair(iCol, move * workRange[iCol]);
    }
    if (workTheta == 0)
        workCount = 0;
    sort(workData.begin(), workData.begin() + workCount);
    workModel->timer.recordFinish(HTICK_CHUZC3);
}